

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O2

string * __thiscall
duckdb::ArrowExtensionMetadata::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ArrowExtensionMetadata *this)

{
  ostream *poVar1;
  ostringstream info;
  ostringstream local_190 [376];
  
  ::std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = ::std::operator<<((ostream *)local_190,"Extension Name: ");
  poVar1 = ::std::operator<<(poVar1,(string *)this);
  ::std::operator<<(poVar1,anon_var_dwarf_4b0ff16 + 8);
  if ((this->vendor_name)._M_string_length != 0) {
    poVar1 = ::std::operator<<((ostream *)local_190,"Vendor: ");
    poVar1 = ::std::operator<<(poVar1,(string *)&this->vendor_name);
    ::std::operator<<(poVar1,anon_var_dwarf_4b0ff16 + 8);
  }
  if ((this->type_name)._M_string_length != 0) {
    poVar1 = ::std::operator<<((ostream *)local_190,"Type: ");
    poVar1 = ::std::operator<<(poVar1,(string *)&this->type_name);
    ::std::operator<<(poVar1,anon_var_dwarf_4b0ff16 + 8);
  }
  if ((this->arrow_format)._M_string_length != 0) {
    poVar1 = ::std::operator<<((ostream *)local_190,"Format: ");
    poVar1 = ::std::operator<<(poVar1,(string *)&this->arrow_format);
    ::std::operator<<(poVar1,anon_var_dwarf_4b0ff16 + 8);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

string ArrowExtensionMetadata::ToString() const {
	std::ostringstream info;
	info << "Extension Name: " << extension_name << "\n";
	if (!vendor_name.empty()) {
		info << "Vendor: " << vendor_name << "\n";
	}
	if (!type_name.empty()) {
		info << "Type: " << type_name << "\n";
	}
	if (!arrow_format.empty()) {
		info << "Format: " << arrow_format << "\n";
	}
	return info.str();
}